

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEngine::leaveMulticastGroup
          (QNativeSocketEngine *this,QHostAddress *groupAddress,QNetworkInterface *iface)

{
  QNativeSocketEnginePrivate *this_00;
  ulong uVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  QNativeSocketEnginePrivate *d;
  QHostAddress *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  bool local_69;
  char local_68 [32];
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QNativeSocketEngine *)0x25fb7a);
  uVar1 = (**(code **)(*in_RDI + 0x78))();
  if ((uVar1 & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,in_stack_ffffffffffffff64,
               (char *)in_stack_ffffffffffffff58);
    QMessageLogger::warning
              (local_28,
               "QNativeSocketEngine::leaveMulticastGroup() was called on an uninitialized socket device"
              );
    local_69 = false;
  }
  else if ((this_00->super_QAbstractSocketEnginePrivate).socketState == BoundState) {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) {
      local_69 = QNativeSocketEnginePrivate::nativeLeaveMulticastGroup
                           ((QNativeSocketEnginePrivate *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff58,(QNetworkInterface *)0x25fc58);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RDI,in_stack_ffffffffffffff64,
                 (char *)in_stack_ffffffffffffff58);
      QMessageLogger::warning
                (local_68,
                 "QNativeSocketEngine::leaveMulticastGroup() was called by a socket other than QAbstractSocket::UdpSocket"
                );
      local_69 = false;
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,in_stack_ffffffffffffff64,
               (char *)in_stack_ffffffffffffff58);
    QMessageLogger::warning
              (local_48,
               "QNativeSocketEngine::leaveMulticastGroup() was not called in QAbstractSocket::BoundState"
              );
    local_69 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEngine::leaveMulticastGroup(const QHostAddress &groupAddress,
                                              const QNetworkInterface &iface)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::leaveMulticastGroup(), false);
    Q_CHECK_STATE(QNativeSocketEngine::leaveMulticastGroup(), QAbstractSocket::BoundState, false);
    Q_CHECK_TYPE(QNativeSocketEngine::leaveMulticastGroup(), QAbstractSocket::UdpSocket, false);
    return d->nativeLeaveMulticastGroup(groupAddress, iface);
}